

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O1

void Abc_SclTimeIncUpdateLevel_rec(Abc_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  uVar2 = Abc_ObjLevelNew(pObj);
  uVar1 = *(uint *)&pObj->field_0x14;
  if ((((uVar1 & 0xf) != 7 || uVar1 >> 0xc != uVar2) || ((pObj->vFanins).nSize < 1)) &&
     (*(uint *)&pObj->field_0x14 = uVar1 & 0xfff | uVar2 << 0xc, 0 < (pObj->vFanouts).nSize)) {
    lVar3 = 0;
    do {
      Abc_SclTimeIncUpdateLevel_rec
                ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar3]]);
      lVar3 = lVar3 + 1;
    } while (lVar3 < (pObj->vFanouts).nSize);
  }
  return;
}

Assistant:

void Abc_SclTimeIncUpdateLevel_rec( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    int i, LevelNew = Abc_ObjLevelNew(pObj);
    if ( LevelNew == (int)pObj->Level && Abc_ObjIsNode(pObj) && Abc_ObjFaninNum(pObj) > 0 )
        return;
    pObj->Level = LevelNew;
    Abc_ObjForEachFanout( pObj, pFanout, i )
        Abc_SclTimeIncUpdateLevel_rec( pFanout );
}